

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::writeCastType(ExprWriter *this,Type *Ty)

{
  ostream *poVar1;
  ret_type pPVar2;
  uint i;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  poVar1 = std::operator<<(this->ss,"(");
  (*Ty->_vptr_Type[3])(&bStack_48,Ty);
  std::operator<<(poVar1,(string *)&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  pPVar2 = llvm::dyn_cast_or_null<PointerType_const,Type>(Ty);
  if ((pPVar2 != (ret_type)0x0) && (pPVar2->isArrayPointer == true)) {
    std::operator<<(this->ss," (");
    for (uVar3 = 0; poVar1 = this->ss, uVar3 < pPVar2->levels; uVar3 = uVar3 + 1) {
      std::operator<<(poVar1,"*");
    }
    std::operator+(&bStack_48,")",&pPVar2->sizes);
    std::operator<<(poVar1,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  std::operator<<(this->ss,")");
  return;
}

Assistant:

void ExprWriter::writeCastType(Type *Ty) {
    ss << "(" << Ty->toString();
    if (auto PT = llvm::dyn_cast_or_null<const PointerType>(Ty)) {
        if (PT->isArrayPointer) {
            ss << " (";
            for (unsigned i = 0; i < PT->levels; i++) {
                ss << "*";
            }
            ss << ")" + PT->sizes;
        }
    }
    ss << ")";
}